

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O2

void __thiscall
YAML::SingleDocParser::HandleFlowMap(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  Token *pTVar2;
  ParserException *pPVar3;
  allocator local_69;
  Mark mark;
  Mark local_58;
  string local_48;
  
  Scanner::pop(this->m_scanner);
  CollectionStack::PushCollectionType
            ((this->m_pCollectionStack)._M_t.
             super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
             .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl,FlowMap);
  do {
    bVar1 = Scanner::empty(this->m_scanner);
    if (bVar1) {
      pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
      mark = Scanner::mark(this->m_scanner);
      std::__cxx11::string::string
                ((string *)&local_48,"end of map flow not found",(allocator *)&local_58);
      ParserException::ParserException(pPVar3,&mark,&local_48);
      __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
    pTVar2 = Scanner::peek(this->m_scanner);
    mark = pTVar2->mark;
    if (pTVar2->type == KEY) {
      Scanner::pop(this->m_scanner);
      HandleNode(this,eventHandler);
    }
    else {
      if (pTVar2->type == FLOW_MAP_END) {
        Scanner::pop(this->m_scanner);
        std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::
        pop_back((deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_> *
                 )(this->m_pCollectionStack)._M_t.
                  super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
                  .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
        return;
      }
      (*eventHandler->_vptr_EventHandler[4])(eventHandler,&mark,0);
    }
    bVar1 = Scanner::empty(this->m_scanner);
    if (bVar1) {
LAB_006ab8f1:
      (*eventHandler->_vptr_EventHandler[4])(eventHandler,&mark,0);
    }
    else {
      pTVar2 = Scanner::peek(this->m_scanner);
      if (pTVar2->type != VALUE) goto LAB_006ab8f1;
      Scanner::pop(this->m_scanner);
      HandleNode(this,eventHandler);
    }
    bVar1 = Scanner::empty(this->m_scanner);
    if (bVar1) {
      pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
      local_58 = Scanner::mark(this->m_scanner);
      std::__cxx11::string::string((string *)&local_48,"end of map flow not found",&local_69);
      ParserException::ParserException(pPVar3,&local_58,&local_48);
      __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
    pTVar2 = Scanner::peek(this->m_scanner);
    if (pTVar2->type != FLOW_MAP_END) {
      if (pTVar2->type != FLOW_ENTRY) {
        pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
        std::__cxx11::string::string
                  ((string *)&local_48,"end of map flow not found",(allocator *)&local_58);
        ParserException::ParserException(pPVar3,&pTVar2->mark,&local_48);
        __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
      }
      Scanner::pop(this->m_scanner);
    }
  } while( true );
}

Assistant:

void SingleDocParser::HandleFlowMap(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::FlowMap);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_MAP_FLOW);

    Token& token = m_scanner.peek();
    const Mark mark = token.mark;
    // first check for end
    if (token.type == Token::FLOW_MAP_END) {
      m_scanner.pop();
      break;
    }

    // grab key (if non-null)
    if (token.type == Token::KEY) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(mark, NullAnchor);
    }

    // now grab value (optional)
    if (!m_scanner.empty() && m_scanner.peek().type == Token::VALUE) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(mark, NullAnchor);
    }

    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_MAP_FLOW);

    // now eat the separator (or could be a map end, which we ignore - but if
    // it's neither, then it's a bad node)
    Token& nextToken = m_scanner.peek();
    if (nextToken.type == Token::FLOW_ENTRY)
      m_scanner.pop();
    else if (nextToken.type != Token::FLOW_MAP_END)
      throw ParserException(nextToken.mark, ErrorMsg::END_OF_MAP_FLOW);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::FlowMap);
}